

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KM_util.cpp
# Opt level: O3

void Kumu::hexdump(byte_t *buf,ui32_t dump_len,FILE *stream)

{
  byte_t *pbVar1;
  ulong uVar2;
  int iVar3;
  byte_t *pbVar4;
  long lVar5;
  byte_t *pbVar6;
  uint uVar7;
  ulong uVar8;
  
  if (buf != (byte_t *)0x0) {
    if (stream == (FILE *)0x0) {
      stream = (FILE *)_stderr;
    }
    if (dump_len != 0) {
      pbVar4 = buf + dump_len;
      pbVar6 = buf + 1;
      do {
        fprintf((FILE *)stream,"  %06x: ");
        uVar2 = 0;
        do {
          uVar8 = uVar2;
          fprintf((FILE *)stream,"%02x ",(ulong)buf[uVar8]);
          uVar7 = (uint)uVar8;
          if (0xe < uVar7) break;
          uVar2 = uVar8 + 1;
        } while (pbVar6 + uVar8 < pbVar4);
        while (uVar7 < 0xf) {
          fputs("   ",(FILE *)stream);
          uVar7 = (int)uVar8 + 1;
          uVar8 = (ulong)uVar7;
        }
        if (buf < pbVar4) {
          lVar5 = 0;
          do {
            uVar7 = (uint)buf[lVar5];
            iVar3 = isprint((uint)buf[lVar5]);
            if (iVar3 == 0) {
              uVar7 = 0x2e;
            }
            fputc(uVar7,(FILE *)stream);
          } while (((uint)lVar5 < 0xf) &&
                  (pbVar1 = pbVar6 + lVar5, lVar5 = lVar5 + 1, pbVar1 < pbVar4));
        }
        fputc(10,(FILE *)stream);
        buf = buf + 0x10;
        pbVar6 = pbVar6 + 0x10;
      } while (buf < pbVar4);
    }
  }
  return;
}

Assistant:

void
Kumu::hexdump(const byte_t* buf, ui32_t dump_len, FILE* stream)
{
  if ( buf == 0 )
    return;

  if ( stream == 0 )
    stream = stderr;

  static ui32_t row_len = 16;
  const byte_t* p = buf;
  const byte_t* end_p = p + dump_len;

  for ( ui32_t line = 0; p < end_p; line++ )
    {
      fprintf(stream, "  %06x: ", line);
      ui32_t i;
      const byte_t* pp;

      for ( pp = p, i = 0; i < row_len && pp < end_p; i++, pp++ )
	fprintf(stream, "%02x ", *pp);

      while ( i++ < row_len )
	fputs("   ", stream);

      for ( pp = p, i = 0; i < row_len && pp < end_p; i++, pp++ )
	fputc((isprint(*pp) ? *pp : '.'), stream);

      fputc('\n', stream);
      p += row_len;
    }
}